

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
CopyAttributeIntoNode(UA_Server *server,UA_Session *session,UA_Node *node,UA_WriteValue *wvalue)

{
  UA_DataValue *value;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  UA_LocalizedText *src;
  size_t arrayDimensionsSize;
  UA_SecureChannel *pUVar5;
  undefined1 uVar6;
  UA_Boolean UVar7;
  UA_StatusCode code;
  uint uVar8;
  UA_DataType *pUVar9;
  char *pcVar10;
  UA_VariableTypeNode *pUVar11;
  UA_Server *server_00;
  UA_LocalizedText *p;
  UA_DataValue local_e8;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  UA_Logger local_48;
  UA_UInt32 local_40;
  uint local_3c;
  UA_Session *local_38;
  
  if (0x15 < wvalue->attributeId - 1) {
    code = 0x80350000;
    goto LAB_0011d041;
  }
  value = &wvalue->value;
  src = (UA_LocalizedText *)(wvalue->value).value.data;
  switch(wvalue->attributeId) {
  default:
    code = 0x80730000;
    break;
  case 3:
    code = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13b720)) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      UA_QualifiedName_deleteMembers(&node->browseName);
      UA_QualifiedName_copy((UA_QualifiedName *)src,&node->browseName);
      return 0;
    }
    break;
  case 4:
    code = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13b750)) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      p = &node->displayName;
LAB_0011ccb1:
      UA_LocalizedText_deleteMembers(p);
      UA_LocalizedText_copy(src,p);
      return 0;
    }
    break;
  case 5:
    code = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13b750)) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      p = &node->description;
      goto LAB_0011ccb1;
    }
    break;
  case 6:
    code = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13b4b0)) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      node->writeMask = (UA_UInt32)(src->locale).length;
      return 0;
    }
    break;
  case 7:
    code = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == (UA_DataType *)0x13b4b0)) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      node->userWriteMask = (UA_UInt32)(src->locale).length;
      return 0;
    }
    break;
  case 8:
    code = 0x80740000;
    if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
          (undefined1  [96])0x0) && ((wvalue->value).value.type == UA_TYPES)) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      uVar4 = node->nodeClass - UA_NODECLASS_OBJECTTYPE >> 3;
      uVar8 = node->nodeClass << 0x1d | uVar4;
      code = 0x805f0000;
      if ((uVar8 < 8) && ((0x8bU >> (uVar4 & 0x1f) & 1) != 0)) {
        *(char *)((long)&(node->nodeId).namespaceIndex + *(long *)(&DAT_00129898 + (ulong)uVar8 * 8)
                 ) = (char)(src->locale).length;
        return 0;
      }
    }
    break;
  case 9:
    uVar6 = (char)node->nodeClass & UA_NODECLASS_REFERENCETYPE;
    goto joined_r0x0011ce4b;
  case 10:
    code = 0x805f0000;
    if ((((node->nodeClass & UA_NODECLASS_REFERENCETYPE) != UA_NODECLASS_UNSPECIFIED) &&
        (code = 0x80740000,
        (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
        (undefined1  [96])0x0)) &&
       (((wvalue->value).value.type == (UA_DataType *)0x13b750 &&
        ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)))) {
      p = (UA_LocalizedText *)&node[1].nodeId.identifier;
      goto LAB_0011ccb1;
    }
    break;
  case 0xb:
    uVar6 = (char)node->nodeClass & UA_NODECLASS_VIEW;
    goto joined_r0x0011ce4b;
  case 0xc:
    if ((node->nodeClass & (UA_NODECLASS_VIEW|UA_NODECLASS_OBJECT)) == UA_NODECLASS_UNSPECIFIED)
    goto LAB_0011cecf;
    code = 0x80740000;
    if ((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) ==
        (undefined1  [96])0x0) break;
    pUVar9 = (UA_DataType *)0x13b3f0;
    goto LAB_0011cdc4;
  case 0xd:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) !=
        UA_NODECLASS_UNSPECIFIED) {
      code = writeValueAttribute(server,(UA_VariableNode *)node,value,&wvalue->indexRange);
LAB_0011cb2a:
      if (code == 0) {
        return 0;
      }
      break;
    }
    goto LAB_0011cecf;
  case 0xe:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) !=
        UA_NODECLASS_UNSPECIFIED) {
      code = 0x80740000;
      if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) ==
            (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x13b690)) ||
         (src < (UA_LocalizedText *)0x2 || (wvalue->value).value.arrayLength != 0)) break;
      pUVar11 = getVariableNodeType(server,(UA_VariableNode *)node);
      if (pUVar11 == (UA_VariableTypeNode *)0x0) {
LAB_0011d039:
        code = 0x80020000;
        break;
      }
      code = writeDataTypeAttribute
                       (server,(UA_VariableNode *)node,(UA_NodeId *)src,&pUVar11->dataType);
      goto LAB_0011cb2a;
    }
    goto LAB_0011cecf;
  case 0xf:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) !=
        UA_NODECLASS_UNSPECIFIED) {
      code = 0x80740000;
      if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) ==
            (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x13b480)) ||
         (src < (UA_LocalizedText *)0x2 || (wvalue->value).value.arrayLength != 0)) break;
      pUVar11 = getVariableNodeType(server,(UA_VariableNode *)node);
      if (pUVar11 == (UA_VariableTypeNode *)0x0) goto LAB_0011d039;
      code = writeValueRankAttribute
                       (server,(UA_VariableNode *)node,(UA_Int32)(src->locale).length,
                        pUVar11->valueRank);
      goto LAB_0011cb2a;
    }
    goto LAB_0011cecf;
  case 0x10:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) !=
        UA_NODECLASS_UNSPECIFIED) {
      code = 0x80740000;
      if ((((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) ==
            (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x13b4b0)) ||
         (arrayDimensionsSize = (wvalue->value).value.arrayLength,
         arrayDimensionsSize == 0 && (UA_LocalizedText *)0x1 < src)) break;
      if (node->nodeClass == UA_NODECLASS_VARIABLETYPE) {
        UVar7 = UA_Node_hasSubTypeOrInstances(node);
        code = 0x80020000;
        if (UVar7) break;
      }
      local_38 = session;
      code = compatibleValueRankArrayDimensions(node[1].nodeClass,arrayDimensionsSize);
      session = local_38;
      if (code != 0) break;
      server_00 = server;
      pUVar11 = getVariableNodeType(server,(UA_VariableNode *)node);
      if (pUVar11 == (UA_VariableTypeNode *)0x0) {
        code = 0x80020000;
        session = local_38;
        break;
      }
      if (pUVar11->arrayDimensions != (UA_UInt32 *)0x0) {
        server_00 = (UA_Server *)pUVar11->arrayDimensionsSize;
        code = compatibleArrayDimensions
                         ((size_t)server_00,pUVar11->arrayDimensions,arrayDimensionsSize,
                          (UA_UInt32 *)src);
        session = local_38;
        if (code != 0) break;
      }
      local_e8.serverTimestamp = 0;
      local_e8.serverPicoseconds = 0;
      local_e8._90_6_ = 0;
      local_e8.sourceTimestamp = 0;
      local_e8.sourcePicoseconds = 0;
      local_e8._74_6_ = 0;
      local_e8.value.arrayDimensions = (UA_UInt32 *)0x0;
      local_e8.status = 0;
      local_e8._60_4_ = 0;
      local_e8.value.data = (void *)0x0;
      local_e8.value.arrayDimensionsSize = 0;
      local_e8.value.storageType = UA_VARIANT_DATA;
      local_e8.value._12_4_ = 0;
      local_e8.value.arrayLength = 0;
      local_e8._0_8_ = 0;
      local_e8.value.type = (UA_DataType *)0x0;
      code = readValueAttribute(server_00,(UA_VariableNode *)node,&local_e8);
      session = local_38;
      if (code == 0) {
        if ((local_e8._0_8_ & 1) != 0) {
          code = compatibleArrayDimensions
                           (arrayDimensionsSize,(UA_UInt32 *)src,local_e8.value.arrayDimensionsSize,
                            local_e8.value.arrayDimensions);
          UA_DataValue_deleteMembers(&local_e8);
          session = local_38;
          if (code != 0) goto LAB_0011cb2a;
        }
        local_48 = (UA_Logger)node[1].browseName.name.length;
        code = UA_Array_copy(src,arrayDimensionsSize,(void **)&node[1].browseName.name,UA_TYPES + 6)
        ;
        session = local_38;
        if (code == 0) {
          free(local_48);
          *(size_t *)&node[1].browseName = arrayDimensionsSize;
          code = 0;
          session = local_38;
        }
      }
      goto LAB_0011cb2a;
    }
LAB_0011cecf:
    code = 0x805f0000;
    break;
  case 0x11:
    code = 0x805f0000;
    if (((((node->nodeClass & UA_NODECLASS_VARIABLE) != UA_NODECLASS_UNSPECIFIED) &&
         (code = 0x80740000,
         (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
         (undefined1  [96])0x0)) && ((wvalue->value).value.type == (UA_DataType *)0x13b3f0)) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      *(char *)&node[2].browseName.namespaceIndex = (char)(src->locale).length;
      return 0;
    }
    break;
  case 0x12:
    code = 0x805f0000;
    if ((((node->nodeClass & UA_NODECLASS_VARIABLE) != UA_NODECLASS_UNSPECIFIED) &&
        (code = 0x80740000,
        (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
        (undefined1  [96])0x0)) &&
       (((wvalue->value).value.type == (UA_DataType *)0x13b3f0 &&
        ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)))) {
      *(char *)((long)&node[2].browseName.namespaceIndex + 1) = (char)(src->locale).length;
      return 0;
    }
    break;
  case 0x13:
    code = 0x805f0000;
    if ((((node->nodeClass & UA_NODECLASS_VARIABLE) != UA_NODECLASS_UNSPECIFIED) &&
        (code = 0x80740000,
        (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
        (undefined1  [96])0x0)) &&
       (((wvalue->value).value.type == (UA_DataType *)0x13b570 &&
        ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)))) {
      node[2].browseName.name.length = (src->locale).length;
      return 0;
    }
    break;
  case 0x14:
    code = 0x805f0000;
    if (((((node->nodeClass & UA_NODECLASS_VARIABLE) != UA_NODECLASS_UNSPECIFIED) &&
         (code = 0x80740000,
         (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
         (undefined1  [96])0x0)) && ((wvalue->value).value.type == UA_TYPES)) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      *(char *)&node[2].browseName.name.data = (char)(src->locale).length;
      return 0;
    }
    break;
  case 0x15:
    code = 0x805f0000;
    if (((node->nodeClass & UA_NODECLASS_METHOD) == UA_NODECLASS_UNSPECIFIED) ||
       (code = 0x80740000,
       (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) == (undefined1  [96])0x0
       )) break;
    pUVar9 = UA_TYPES;
LAB_0011cdc4:
    code = 0x80740000;
    if (((wvalue->value).value.type == pUVar9) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      *(char *)&node[1].nodeId.namespaceIndex = (char)(src->locale).length;
      return 0;
    }
    break;
  case 0x16:
    uVar6 = (char)node->nodeClass & UA_NODECLASS_METHOD;
joined_r0x0011ce4b:
    code = 0x805f0000;
    if ((((uVar6 != UA_NODECLASS_UNSPECIFIED) &&
         (code = 0x80740000,
         (undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) !=
         (undefined1  [96])0x0)) && ((wvalue->value).value.type == UA_TYPES)) &&
       ((UA_LocalizedText *)0x1 < src && (wvalue->value).value.arrayLength == 0)) {
      *(char *)((long)&node[1].nodeId.namespaceIndex + 1) = (char)(src->locale).length;
      return 0;
    }
  }
LAB_0011d041:
  local_48 = (server->config).logger;
  pUVar5 = session->channel;
  if (pUVar5 == (UA_SecureChannel *)0x0) {
    local_3c = 0;
    local_40 = 0;
  }
  else {
    if (pUVar5->connection == (UA_Connection *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = pUVar5->connection->sockfd;
    }
    local_40 = (pUVar5->securityToken).channelId;
  }
  uVar4 = (session->sessionId).identifier.numeric;
  local_80 = (ulong)(session->sessionId).identifier.guid.data2;
  local_78 = (ulong)(session->sessionId).identifier.guid.data3;
  local_70 = (ulong)(session->sessionId).identifier.guid.data4[0];
  local_68 = (ulong)(session->sessionId).identifier.guid.data4[1];
  local_60 = (ulong)(session->sessionId).identifier.guid.data4[2];
  local_58 = (ulong)(session->sessionId).identifier.guid.data4[3];
  local_50 = (ulong)(session->sessionId).identifier.guid.data4[4];
  bVar1 = (session->sessionId).identifier.guid.data4[5];
  bVar2 = (session->sessionId).identifier.guid.data4[6];
  bVar3 = (session->sessionId).identifier.guid.data4[7];
  pcVar10 = UA_StatusCode_name(code);
  UA_LOG_INFO(local_48,UA_LOGCATEGORY_SESSION,
              "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | WriteRequest returned status code %s"
              ,(ulong)local_3c,(ulong)local_40,(ulong)uVar4,local_80,local_78,local_70,local_68,
              local_60,local_58,local_50,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,pcVar10);
  return code;
}

Assistant:

static UA_StatusCode
CopyAttributeIntoNode(UA_Server *server, UA_Session *session,
                      UA_Node *node, const UA_WriteValue *wvalue) {
    const void *value = wvalue->value.value.data;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(wvalue->attributeId) {
    case UA_ATTRIBUTEID_NODEID:
    case UA_ATTRIBUTEID_NODECLASS:
        retval = UA_STATUSCODE_BADWRITENOTSUPPORTED;
        break;
    case UA_ATTRIBUTEID_BROWSENAME:
        CHECK_DATATYPE_SCALAR(QUALIFIEDNAME);
        UA_QualifiedName_deleteMembers(&node->browseName);
        UA_QualifiedName_copy(value, &node->browseName);
        break;
    case UA_ATTRIBUTEID_DISPLAYNAME:
        CHECK_DATATYPE_SCALAR(LOCALIZEDTEXT);
        UA_LocalizedText_deleteMembers(&node->displayName);
        UA_LocalizedText_copy(value, &node->displayName);
        break;
    case UA_ATTRIBUTEID_DESCRIPTION:
        CHECK_DATATYPE_SCALAR(LOCALIZEDTEXT);
        UA_LocalizedText_deleteMembers(&node->description);
        UA_LocalizedText_copy(value, &node->description);
        break;
    case UA_ATTRIBUTEID_WRITEMASK:
        CHECK_DATATYPE_SCALAR(UINT32);
        node->writeMask = *(const UA_UInt32*)value;
        break;
    case UA_ATTRIBUTEID_USERWRITEMASK:
        CHECK_DATATYPE_SCALAR(UINT32);
        node->userWriteMask = *(const UA_UInt32*)value;
        break;
    case UA_ATTRIBUTEID_ISABSTRACT:
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        retval = writeIsAbstractAttribute(node, *(const UA_Boolean*)value);
        break;
    case UA_ATTRIBUTEID_SYMMETRIC:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_REFERENCETYPE);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_ReferenceTypeNode*)node)->symmetric = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_INVERSENAME:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_REFERENCETYPE);
        CHECK_DATATYPE_SCALAR(LOCALIZEDTEXT);
        UA_LocalizedText_deleteMembers(&((UA_ReferenceTypeNode*)node)->inverseName);
        UA_LocalizedText_copy(value, &((UA_ReferenceTypeNode*)node)->inverseName);
        break;
    case UA_ATTRIBUTEID_CONTAINSNOLOOPS:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VIEW);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_ViewNode*)node)->containsNoLoops = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_EVENTNOTIFIER:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VIEW | UA_NODECLASS_OBJECT);
        CHECK_DATATYPE_SCALAR(BYTE);
        ((UA_ViewNode*)node)->eventNotifier = *(const UA_Byte*)value;
        break;
    case UA_ATTRIBUTEID_VALUE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        retval = writeValueAttribute(server, (UA_VariableNode*)node,
                                     &wvalue->value, &wvalue->indexRange);
        break;
    case UA_ATTRIBUTEID_DATATYPE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        CHECK_DATATYPE_SCALAR(NODEID);
        retval = writeDataTypeAttributeWithVT(server, (UA_VariableNode*)node, (const UA_NodeId*)value);
        break;
    case UA_ATTRIBUTEID_VALUERANK:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        CHECK_DATATYPE_SCALAR(INT32);
        retval = writeValueRankAttributeWithVT(server, (UA_VariableNode*)node, *(const UA_Int32*)value);
        break;
    case UA_ATTRIBUTEID_ARRAYDIMENSIONS:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        CHECK_DATATYPE_ARRAY(UINT32);
        retval = writeArrayDimensionsAttribute(server, (UA_VariableNode*)node,
                                               wvalue->value.value.arrayLength,
                                               wvalue->value.value.data);
        break;
    case UA_ATTRIBUTEID_ACCESSLEVEL:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(BYTE);
        ((UA_VariableNode*)node)->accessLevel = *(const UA_Byte*)value;
        break;
    case UA_ATTRIBUTEID_USERACCESSLEVEL:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(BYTE);
        ((UA_VariableNode*)node)->userAccessLevel = *(const UA_Byte*)value;
        break;
    case UA_ATTRIBUTEID_MINIMUMSAMPLINGINTERVAL:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(DOUBLE);
        ((UA_VariableNode*)node)->minimumSamplingInterval = *(const UA_Double*)value;
        break;
    case UA_ATTRIBUTEID_HISTORIZING:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_VariableNode*)node)->historizing = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_EXECUTABLE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_METHOD);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_MethodNode*)node)->executable = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_USEREXECUTABLE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_METHOD);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_MethodNode*)node)->userExecutable = *(const UA_Boolean*)value;
        break;
    default:
        retval = UA_STATUSCODE_BADATTRIBUTEIDINVALID;
        break;
    }
    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "WriteRequest returned status code %s",
                            UA_StatusCode_name(retval));
    return retval;
}